

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBblif.c
# Opt level: O1

Bbl_Man_t * Bbl_ManFromAbc(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  long *plVar2;
  Bbl_Man_t *p;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    p = Bbl_ManStart(pNtk->pName);
    __ptr = Abc_NtkDfs(pNtk,0);
    pVVar3 = pNtk->vCis;
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        Bbl_ManCreateObject(p,BBL_OBJ_CI,*(int *)((long)pVVar3->pArray[lVar5] + 0x10),0,(char *)0x0)
        ;
        lVar5 = lVar5 + 1;
        pVVar3 = pNtk->vCis;
      } while (lVar5 < pVVar3->nSize);
    }
    if (0 < __ptr->nSize) {
      lVar5 = 0;
      do {
        pvVar1 = __ptr->pArray[lVar5];
        Bbl_ManCreateObject(p,BBL_OBJ_NODE,*(int *)((long)pvVar1 + 0x10),
                            *(int *)((long)pvVar1 + 0x1c),*(char **)((long)pvVar1 + 0x38));
        lVar5 = lVar5 + 1;
      } while (lVar5 < __ptr->nSize);
    }
    pVVar3 = pNtk->vCos;
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        Bbl_ManCreateObject(p,BBL_OBJ_CO,*(int *)((long)pVVar3->pArray[lVar5] + 0x10),1,(char *)0x0)
        ;
        lVar5 = lVar5 + 1;
        pVVar3 = pNtk->vCos;
      } while (lVar5 < pVVar3->nSize);
    }
    if (0 < __ptr->nSize) {
      lVar5 = 0;
      do {
        plVar2 = (long *)__ptr->pArray[lVar5];
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar4 = 0;
          do {
            Bbl_ManAddFanin(p,(int)plVar2[2],
                            *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                              (long)*(int *)(plVar2[4] + lVar4 * 4) * 8) + 0x10));
            lVar4 = lVar4 + 1;
          } while (lVar4 < *(int *)((long)plVar2 + 0x1c));
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < __ptr->nSize);
    }
    pVVar3 = pNtk->vCos;
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        plVar2 = (long *)pVVar3->pArray[lVar5];
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar4 = 0;
          do {
            Bbl_ManAddFanin(p,(int)plVar2[2],
                            *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                              (long)*(int *)(plVar2[4] + lVar4 * 4) * 8) + 0x10));
            lVar4 = lVar4 + 1;
          } while (lVar4 < *(int *)((long)plVar2 + 0x1c));
        }
        lVar5 = lVar5 + 1;
        pVVar3 = pNtk->vCos;
      } while (lVar5 < pVVar3->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    Bbl_ManCheck(p);
    return p;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBblif.c"
                ,0x3c,"Bbl_Man_t *Bbl_ManFromAbc(Abc_Ntk_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


// For description of Binary BLIF format, refer to "abc/src/aig/bbl/bblif.h"

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Fnction*************************************************************

  Synopsis    [Construct manager from the ABC network.]

  Description [In the ABC network each object has a unique integer ID.
  This ID is used when we construct objects of the BBLIF manager 
  corresponding to each object of the ABC network. The objects can be
  added to the manager in any order (although below they are added in the
  topological order), but by the time fanin/fanout connections are created, 
  corresponding objects are already constructed. In the end the checking
  procedure is called.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Bbl_Man_t * Bbl_ManFromAbc( Abc_Ntk_t * pNtk )
{
    Bbl_Man_t * p;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // start the data manager
    p = Bbl_ManStart( Abc_NtkName(pNtk) );
    // collect internal nodes to be added
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // create combinational inputs
    Abc_NtkForEachCi( pNtk, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_CI, Abc_ObjId(pObj), 0, NULL );
    // create internal nodes 
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_NODE, Abc_ObjId(pObj), Abc_ObjFaninNum(pObj), (char *)pObj->pData );
    // create combinational outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_CO, Abc_ObjId(pObj), 1, NULL );
    // create fanin/fanout connections for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Bbl_ManAddFanin( p, Abc_ObjId(pObj), Abc_ObjId(pFanin) );
    // create fanin/fanout connections for combinational outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Bbl_ManAddFanin( p, Abc_ObjId(pObj), Abc_ObjId(pFanin) );
    Vec_PtrFree( vNodes );
    // sanity check
    Bbl_ManCheck( p );
    return p;
}